

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping.cpp
# Opt level: O2

void test_2d_static<1ul,1ul,1ul,30ul>(void)

{
  int *t;
  unsigned_long *puVar1;
  int j;
  unsigned_long *puVar2;
  int j_1;
  unsigned_long *local_c0;
  value_type true_idx;
  int *local_b0;
  int dptr [30];
  
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xb9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xbb,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xbc,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xbe,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xbf,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xc5,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,199,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,200,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xca,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = 0x1e;
  puVar1 = (unsigned_long *)dptr;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xcb,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",puVar1,&true_idx);
  for (puVar2 = (unsigned_long *)0x0; puVar2 != (unsigned_long *)&DAT_0000001e;
      puVar2 = (unsigned_long *)((long)puVar2 + 1)) {
    local_c0 = puVar2;
    true_idx = (value_type)puVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0xd5,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_c0,&true_idx);
    local_b0 = dptr + true_idx;
    local_c0 = puVar1;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0xd7,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",(int **)&local_c0
               ,&local_b0);
    *(undefined4 *)puVar1 = 0x2a;
    local_c0 = (unsigned_long *)CONCAT44(local_c0._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0xdb,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",(int *)puVar1,
               (int *)&local_c0);
    puVar1 = (unsigned_long *)((long)puVar1 + 4);
  }
  puVar1 = (unsigned_long *)dptr;
  for (puVar2 = (unsigned_long *)0x0; puVar2 != (unsigned_long *)&DAT_0000001e;
      puVar2 = (unsigned_long *)((long)puVar2 + 1)) {
    local_c0 = puVar2;
    true_idx = (value_type)puVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(sub_l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0xe5,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_c0,&true_idx);
    local_b0 = dptr + true_idx;
    local_c0 = puVar1;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0xe7,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",(int **)&local_c0
               ,&local_b0);
    *(int *)puVar1 = 0x11;
    local_c0 = (unsigned_long *)CONCAT44(local_c0._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[sub_l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0xeb,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",(int *)puVar1,
               (int *)&local_c0);
    puVar1 = (unsigned_long *)((long)puVar1 + 4);
  }
  t = dptr;
  for (puVar1 = (unsigned_long *)0x0; puVar1 != (unsigned_long *)&DAT_0000001e;
      puVar1 = (unsigned_long *)((long)puVar1 + 1)) {
    local_c0 = puVar1;
    true_idx = (value_type)puVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0xf4,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_c0,&true_idx);
    local_c0 = (unsigned_long *)CONCAT44(local_c0._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0xfb,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 30UL]",t,
               (int *)&local_c0);
    t = t + 1;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_left<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_left<
        dimensions<X / N, Y / M>, dimensions<N, M>, dimensions<0, 0> 
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    int dptr[X * Y];

    // Set all elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.steps()[0]))
           && (0 == (j % sub_l.steps()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}